

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

string * qpdf::Name::normalize(string *__return_storage_ptr__,string *name)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  char local_3f;
  char local_3e;
  undefined1 local_3d;
  
  if (name->_M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::at((ulong)name);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    for (uVar3 = 1; uVar3 < name->_M_string_length; uVar3 = uVar3 + 1) {
      pbVar2 = (byte *)std::__cxx11::string::at((ulong)name);
      bVar1 = *pbVar2;
      if (bVar1 == 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else if ((((char)bVar1 < '!') ||
               ((bVar1 - 0x23 < 0x3b &&
                ((0x50000000a001065U >> ((ulong)(bVar1 - 0x23) & 0x3f) & 1) != 0)))) ||
              ((bVar1 - 0x7b < 5 && ((0x15U >> (bVar1 - 0x7b & 0x1f) & 1) != 0)))) {
        local_3f = "0123456789abcdef"[bVar1 >> 4];
        local_3e = "0123456789abcdef"[bVar1 & 0xf];
        local_40 = 0x23;
        local_48 = 3;
        local_3d = 0;
        local_50 = &local_40;
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
Name::normalize(std::string const& name)
{
    if (name.empty()) {
        return name;
    }
    std::string result;
    result += name.at(0);
    for (size_t i = 1; i < name.length(); ++i) {
        char ch = name.at(i);
        // Don't use locale/ctype here; follow PDF spec guidelines.
        if (ch == '\0') {
            // QPDFTokenizer embeds a null character to encode an invalid #.
            result += "#";
        } else if (
            ch < 33 || ch == '#' || ch == '/' || ch == '(' || ch == ')' || ch == '{' || ch == '}' ||
            ch == '<' || ch == '>' || ch == '[' || ch == ']' || ch == '%' || ch > 126) {
            result += util::hex_encode_char(ch);
        } else {
            result += ch;
        }
    }
    return result;
}